

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_remove_output(wally_tx *tx,size_t index)

{
  _Bool _Var1;
  size_t sVar2;
  int iVar3;
  wally_tx_output *output;
  
  _Var1 = is_valid_tx(tx);
  iVar3 = -2;
  if ((_Var1) && (index < tx->num_outputs)) {
    output = tx->outputs + index;
    iVar3 = 0;
    tx_output_free(output,false);
    sVar2 = tx->num_outputs;
    if (sVar2 - 1 != index) {
      memmove(output,output + 1,(sVar2 + ~index) * 0x70);
      sVar2 = tx->num_outputs;
    }
    wally_clear(tx->outputs + (sVar2 - 1),0x70);
    tx->num_outputs = tx->num_outputs - 1;
  }
  return iVar3;
}

Assistant:

int wally_tx_remove_output(struct wally_tx *tx, size_t index)
{
    struct wally_tx_output *output;

    if (!is_valid_tx(tx) || index >= tx->num_outputs)
        return WALLY_EINVAL;

    output = tx->outputs + index;
    tx_output_free(output, false);
    if (index != tx->num_outputs - 1)
        memmove(output, output + 1,
                (tx->num_outputs - index - 1) * sizeof(*output));
    wally_clear(tx->outputs + tx->num_outputs - 1, sizeof(*output));

    tx->num_outputs -= 1;
    return WALLY_OK;
}